

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O1

string * __thiscall
libcalc::t2s_abi_cxx11_
          (string *__return_storage_ptr__,libcalc *this,
          vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *tokens)

{
  long *plVar1;
  long lVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  long *plVar6;
  size_type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  __str.field_2._8_8_ = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)__str.field_2._8_8_;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar6 = *(long **)this;
  plVar1 = *(long **)(this + 8);
  if (plVar6 != plVar1) {
    do {
      lVar2 = *(long *)*plVar6;
      local_58 = &__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,lVar2,((long *)*plVar6)[1] + lVar2);
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      if (local_58 != &__str._M_string_length) {
        operator_delete(local_58);
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != plVar1);
  }
  sVar5 = __return_storage_ptr__->_M_string_length - 1;
  if (__return_storage_ptr__->_M_string_length != 0) {
    __return_storage_ptr__->_M_string_length = sVar5;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar5] = '\0';
    return __return_storage_ptr__;
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
  ;
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if (pcVar3 != (pointer)__str.field_2._8_8_) {
    operator_delete(pcVar3);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

std::string t2s(std::vector<Token *> tokens) {
  std::string out;

  for (Token *t : tokens) {
    out += t->value + " ";
  }

  out.erase(out.length() - 1);

  return out;
}